

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  Btree *pBVar4;
  long in_FS_OFFSET;
  Parse sParse;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = sqlite3FindDbName(pDb,zDb);
  if (uVar2 == 1) {
    memset(&sParse,0xaa,0x1a8);
    sqlite3ParseObjectInit(&sParse,pDb);
    iVar3 = sqlite3OpenTempDatabase(&sParse);
    if (iVar3 != 0) {
      pBVar4 = (Btree *)0x0;
      sqlite3ErrorWithMsg(pErrorDb,sParse.rc,"%s",sParse.zErrMsg);
      sqlite3DbFree(pErrorDb,sParse.zErrMsg);
      sqlite3ParseObjectReset(&sParse);
      goto LAB_00121b97;
    }
    sqlite3DbFree(pErrorDb,sParse.zErrMsg);
    sqlite3ParseObjectReset(&sParse);
  }
  else if ((int)uVar2 < 0) {
    pBVar4 = (Btree *)0x0;
    sqlite3ErrorWithMsg(pErrorDb,1,"unknown database %s",zDb);
    goto LAB_00121b97;
  }
  pBVar4 = pDb->aDb[uVar2].pBt;
LAB_00121b97:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pBVar4;
  }
  __stack_chk_fail();
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse sParse;
    int rc = 0;
    sqlite3ParseObjectInit(&sParse,pDb);
    if( sqlite3OpenTempDatabase(&sParse) ){
      sqlite3ErrorWithMsg(pErrorDb, sParse.rc, "%s", sParse.zErrMsg);
      rc = SQLITE_ERROR;
    }
    sqlite3DbFree(pErrorDb, sParse.zErrMsg);
    sqlite3ParseObjectReset(&sParse);
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3ErrorWithMsg(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}